

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.h
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::SetMakefile(cmExportBuildFileGenerator *this,cmMakefile *mf)

{
  cmListFileBacktrace local_48;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  cmExportBuildFileGenerator *this_local;
  
  this->Makefile = mf;
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  cmMakefile::GetBacktrace(&local_48,this->Makefile);
  cmListFileBacktrace::operator=(&this->Backtrace,&local_48);
  cmListFileBacktrace::~cmListFileBacktrace(&local_48);
  return;
}

Assistant:

void SetMakefile(cmMakefile *mf) {
    this->Makefile = mf;
    this->Backtrace = this->Makefile->GetBacktrace();
  }